

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Texture.cpp
# Opt level: O3

int sf::Texture::bind(int __fd,sockaddr *__addr,socklen_t __len)

{
  byte bVar1;
  int extraout_EAX;
  undefined4 in_register_0000003c;
  long lVar2;
  float fVar3;
  TransientContextLock lock;
  TransientContextLock local_59;
  ulong local_58 [3];
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  long local_28;
  undefined8 uStack_20;
  
  lVar2 = CONCAT44(in_register_0000003c,__fd);
  GlResource::TransientContextLock::TransientContextLock(&local_59);
  if ((lVar2 == 0) || (*(GLuint *)(lVar2 + 0x10) == 0)) {
    (*sf_glad_glBindTexture)(0xde1,0);
    (*sf_glad_glMatrixMode)(0x1702);
    (*sf_glad_glLoadIdentity)();
    (*sf_glad_glMatrixMode)(0x1700);
  }
  else {
    (*sf_glad_glBindTexture)(0xde1,*(GLuint *)(lVar2 + 0x10));
    if ((int)__addr == 1) {
      local_58[0] = (ulong)(uint)(1.0 / (float)*(uint *)(lVar2 + 8));
      fVar3 = 1.0 / (float)*(uint *)(lVar2 + 0xc);
      local_58[2] = (ulong)(uint)fVar3;
      bVar1 = *(byte *)(lVar2 + 0x17);
    }
    else {
      if (*(char *)(lVar2 + 0x17) != '\x01') goto LAB_001c558f;
      local_58[0] = 0x3f800000;
      local_58[2] = 0x3f800000;
      fVar3 = 1.0;
      bVar1 = 1;
    }
    local_58[2] = local_58[2] << 0x20;
    uStack_20 = 0x3f80000000000000;
    local_28 = 0;
    uStack_30 = 0x3f800000;
    local_38 = 0;
    uStack_40 = 0;
    local_58[1] = 0;
    if ((bVar1 & 1) != 0) {
      local_58[2] = (ulong)(uint)fVar3 << 0x20 ^ 0x8000000000000000;
      local_28 = (ulong)(uint)((float)*(uint *)(lVar2 + 4) / (float)*(uint *)(lVar2 + 0xc)) << 0x20;
    }
    (*sf_glad_glMatrixMode)(0x1702);
    (*sf_glad_glLoadMatrixf)((GLfloat *)local_58);
    (*sf_glad_glMatrixMode)(0x1700);
  }
LAB_001c558f:
  GlResource::TransientContextLock::~TransientContextLock(&local_59);
  return extraout_EAX;
}

Assistant:

void Texture::bind(const Texture* texture, CoordinateType coordinateType)
{
    TransientContextLock lock;

    if (texture && texture->m_texture)
    {
        // Bind the texture
        glCheck(glBindTexture(GL_TEXTURE_2D, texture->m_texture));

        // Check if we need to define a special texture matrix
        if ((coordinateType == Pixels) || texture->m_pixelsFlipped)
        {
            GLfloat matrix[16] = {1.f, 0.f, 0.f, 0.f,
                                  0.f, 1.f, 0.f, 0.f,
                                  0.f, 0.f, 1.f, 0.f,
                                  0.f, 0.f, 0.f, 1.f};

            // If non-normalized coordinates (= pixels) are requested, we need to
            // setup scale factors that convert the range [0 .. size] to [0 .. 1]
            if (coordinateType == Pixels)
            {
                matrix[0] = 1.f / static_cast<float>(texture->m_actualSize.x);
                matrix[5] = 1.f / static_cast<float>(texture->m_actualSize.y);
            }

            // If pixels are flipped we must invert the Y axis
            if (texture->m_pixelsFlipped)
            {
                matrix[5] = -matrix[5];
                matrix[13] = static_cast<float>(texture->m_size.y) / static_cast<float>(texture->m_actualSize.y);
            }

            // Load the matrix
            glCheck(glMatrixMode(GL_TEXTURE));
            glCheck(glLoadMatrixf(matrix));

            // Go back to model-view mode (sf::RenderTarget relies on it)
            glCheck(glMatrixMode(GL_MODELVIEW));
        }
    }
    else
    {
        // Bind no texture
        glCheck(glBindTexture(GL_TEXTURE_2D, 0));

        // Reset the texture matrix
        glCheck(glMatrixMode(GL_TEXTURE));
        glCheck(glLoadIdentity());

        // Go back to model-view mode (sf::RenderTarget relies on it)
        glCheck(glMatrixMode(GL_MODELVIEW));
    }
}